

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O1

int dwarf_get_ranges_baseaddress
              (Dwarf_Debug dw_dbg,Dwarf_Die dw_die,Dwarf_Bool *dw_known_base,
              Dwarf_Unsigned *dw_baseaddress,Dwarf_Bool *dw_at_ranges_offset_present,
              Dwarf_Unsigned *dw_at_ranges_offset,Dwarf_Error *dw_error)

{
  Dwarf_CU_Context_conflict pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *msg;
  Dwarf_Unsigned *pDVar5;
  Dwarf_Signed errval;
  Dwarf_Bool DVar6;
  Dwarf_Unsigned DVar7;
  Dwarf_Bool DVar8;
  Dwarf_Bool haslowpc;
  Dwarf_Bool hasatranges;
  Dwarf_Unsigned die_ranges_offset;
  Dwarf_Unsigned rangeoffset_local;
  Dwarf_Attribute local_80;
  Dwarf_Bool local_74;
  Dwarf_Bool local_70;
  Dwarf_Bool local_6c;
  Dwarf_Unsigned local_68;
  Dwarf_Addr local_60;
  Dwarf_Off local_58;
  Dwarf_Unsigned local_50;
  Dwarf_Bool *local_48;
  Dwarf_Bool *local_40;
  Dwarf_Unsigned *local_38;
  
  local_68 = 0;
  if ((dw_dbg == (Dwarf_Debug)0x0) || (dw_dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_baseaddress()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dw_dbg = (Dwarf_Debug)0x0;
    goto LAB_001c695d;
  }
  if (dw_die == (Dwarf_Die)0x0) {
    if (dw_known_base != (Dwarf_Bool *)0x0) {
      *dw_known_base = 0;
      *dw_at_ranges_offset_present = 0;
    }
    if (dw_baseaddress == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *dw_baseaddress = 0;
    *dw_at_ranges_offset = 0;
    return 0;
  }
  DVar6 = 0;
  local_6c = 0;
  local_70 = 0;
  local_80 = (Dwarf_Attribute)0x0;
  local_58 = 0;
  local_60 = 0;
  local_40 = dw_known_base;
  local_38 = dw_baseaddress;
  iVar4 = dwarf_hasattr(dw_die,0x55,&local_6c,dw_error);
  bVar3 = true;
  if (iVar4 == 0) {
    if (local_6c == 0) {
      DVar6 = 0;
      bVar2 = true;
      DVar8 = 0;
      DVar7 = 0;
LAB_001c69e4:
      iVar4 = 0;
    }
    else {
      iVar4 = dwarf_attr(dw_die,0x55,&local_80,dw_error);
      if (iVar4 == 0) {
        iVar4 = dwarf_global_formref(local_80,&local_58,dw_error);
        dwarf_dealloc_attribute(local_80);
        if (iVar4 == 1) {
          dwarf_dealloc_error(dw_dbg,*dw_error);
          *dw_error = (Dwarf_Error)0x0;
          iVar4 = 1;
          goto LAB_001c6a32;
        }
        local_80 = (Dwarf_Attribute)0x0;
        local_68 = local_58;
        iVar4 = dwarf_hasattr(dw_die,0x11,&local_70,dw_error);
        DVar6 = 1;
        if ((iVar4 == 0) && (iVar4 = dwarf_lowpc(dw_die,&local_60,dw_error), iVar4 == 0)) {
          bVar2 = false;
          DVar6 = 1;
          bVar3 = false;
          DVar8 = 1;
          DVar7 = local_60;
          goto LAB_001c69e4;
        }
        if (iVar4 == 1) {
          dwarf_dealloc_error(dw_dbg,*dw_error);
          *dw_error = (Dwarf_Error)0x0;
        }
        bVar2 = false;
        iVar4 = 0;
      }
      else {
        if (iVar4 == 1) {
          dwarf_dealloc_error(dw_dbg,*dw_error);
          *dw_error = (Dwarf_Error)0x0;
        }
LAB_001c6a32:
        DVar6 = 0;
        bVar2 = true;
      }
      DVar7 = 0;
      DVar8 = 0;
      bVar3 = true;
    }
  }
  else {
    bVar2 = true;
    DVar8 = 0;
    DVar7 = 0;
  }
  if (iVar4 == 1) {
    local_74 = DVar8;
    local_50 = DVar7;
    local_48 = dw_at_ranges_offset_present;
    dwarf_dealloc_error(dw_dbg,*dw_error);
    *dw_error = (Dwarf_Error)0x0;
    DVar7 = local_50;
    dw_at_ranges_offset_present = local_48;
    DVar8 = local_74;
  }
  pDVar1 = dw_die->di_cu_context;
  if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
    if (bVar2) {
      DVar6 = pDVar1->cc_at_ranges_offset_present;
      pDVar5 = &pDVar1->cc_at_ranges_offset;
    }
    else {
      pDVar5 = &local_68;
    }
    if (dw_at_ranges_offset != (Dwarf_Unsigned *)0x0) {
      *dw_at_ranges_offset = *pDVar5;
    }
    if (dw_at_ranges_offset_present != (Dwarf_Bool *)0x0) {
      *dw_at_ranges_offset_present = DVar6;
    }
    if (bVar3) {
      if (pDVar1->cc_low_pc_present == 0) {
        DVar7 = 0;
        DVar8 = 0;
      }
      else {
        DVar7 = pDVar1->cc_low_pc;
        DVar8 = 1;
      }
    }
    if (local_38 == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *local_38 = DVar7;
    *local_40 = DVar8;
    return 0;
  }
  msg = "DW_DLE_DIE_NO_CU_CONTEXT: in a call to dwarf_get_ranges_baseaddress";
  errval = 0x68;
LAB_001c695d:
  _dwarf_error_string(dw_dbg,dw_error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_get_ranges_baseaddress(Dwarf_Debug dw_dbg,
    Dwarf_Die       dw_die,
    Dwarf_Bool     *dw_known_base,
    Dwarf_Unsigned *dw_baseaddress,
    Dwarf_Bool     *dw_at_ranges_offset_present,
    Dwarf_Unsigned *dw_at_ranges_offset,
    Dwarf_Error    *dw_error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Unsigned local_ranges_offset = 0;
    Dwarf_Bool     local_ranges_offset_present = FALSE;
    Dwarf_Unsigned local_base_addr= 0;
    Dwarf_Bool     local_base_addr_present = FALSE;
    Dwarf_Bool     have_die_ranges_offset = FALSE;
    Dwarf_Unsigned die_ranges_offset = 0;
    Dwarf_Bool     have_die_base_addr = FALSE;
    Dwarf_Unsigned die_base_addr = 0;
    int            res = 0;

    CHECK_DBG(dw_dbg,dw_error,"dwarf_get_ranges_baseaddress()");
    if (!dw_die) {
        if (dw_known_base) {
            *dw_known_base = FALSE;
            *dw_at_ranges_offset_present = FALSE;
        }
        if (dw_baseaddress) {
            *dw_baseaddress = 0;
            *dw_at_ranges_offset = 0;
        }
        return DW_DLV_OK;
    }
    /*  If the DIE passed in has a DW_AT_ranges attribute
        we will use that DIE ranges offset.
        Otherwise we use the DW_AT_ranges from the
        CU DIE (if any)
        If the DIE passed in has a DW_AT_low_pc
        attribute we will use that as the ranges
        base address, otherwise we use the
        cu context base adddress (if present) ...
        which may be incorrect... ? */
    res = _dwarf_determine_die_range_offset(dw_dbg,
        dw_die,&have_die_ranges_offset,&die_ranges_offset,
        &have_die_base_addr,&die_base_addr,dw_error);
    if (res != DW_DLV_OK ) {
        if (res == DW_DLV_ERROR) {
            /*  Suppressing knowledge of any error */
            dwarf_dealloc_error(dw_dbg,*dw_error);
            *dw_error = 0;
        }
    }

    context = dw_die->di_cu_context;
    if (!context) {
        _dwarf_error_string(dw_dbg, dw_error,
            DW_DLE_DIE_NO_CU_CONTEXT,
            "DW_DLE_DIE_NO_CU_CONTEXT: in a call to "
            "dwarf_get_ranges_baseaddress");
        return DW_DLV_ERROR;
    }
    if (have_die_ranges_offset) {
        local_ranges_offset_present = have_die_ranges_offset;
        local_ranges_offset = die_ranges_offset;
    } else {
        local_ranges_offset_present =
            context->cc_at_ranges_offset_present;
        local_ranges_offset =
            context->cc_at_ranges_offset;
    }
    if (dw_at_ranges_offset) {
        *dw_at_ranges_offset = local_ranges_offset;
    }
    if (dw_at_ranges_offset_present) {
        *dw_at_ranges_offset_present = local_ranges_offset_present;
    }
    if (have_die_base_addr) {
        local_base_addr_present = have_die_base_addr;
        local_base_addr = die_base_addr;
    } else {
        if (context->cc_low_pc_present ) {
            local_base_addr_present = TRUE;
            local_base_addr = context->cc_low_pc;
        }
    }
    if (dw_baseaddress) {
        /*  Unless cc_low_pc_present is TRUE
            cc_low_pc is always zero, and it
            could be zero regardless. */

        *dw_baseaddress = local_base_addr;
        *dw_known_base = local_base_addr_present;
    }
    return DW_DLV_OK;
}